

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vardata.c
# Opt level: O2

int vardata_add_varset(vardata *data,char *name,char *description)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  vardata_varset *pvVar5;
  int iVar6;
  
  if (data->validated == 0) {
    iVar1 = symtab_put(data->symtab,name,2,data->varsetsnum);
    if (iVar1 == -1) {
      iVar1 = -1;
    }
    else {
      iVar1 = data->varsetsnum;
      pcVar3 = strdup(name);
      if (description == (char *)0x0) {
        pcVar4 = (char *)0x0;
      }
      else {
        pcVar4 = strdup(description);
      }
      iVar6 = data->varsetsmax;
      if (iVar1 < iVar6) {
        pvVar5 = data->varsets;
        iVar6 = iVar1;
      }
      else {
        iVar2 = 0x10;
        if (iVar6 != 0) {
          iVar2 = iVar6 * 2;
        }
        data->varsetsmax = iVar2;
        pvVar5 = (vardata_varset *)realloc(data->varsets,(long)iVar2 << 4);
        data->varsets = pvVar5;
        iVar6 = data->varsetsnum;
      }
      data->varsetsnum = iVar6 + 1;
      pvVar5[iVar6].name = pcVar3;
      pvVar5[iVar6].description = pcVar4;
    }
    return iVar1;
  }
  abort();
}

Assistant:

int vardata_add_varset(struct vardata *data, const char *name, const char *description) {
	if (data->validated)
		abort();
	if (symtab_put(data->symtab, name, VARDATA_ST_VARSET, data->varsetsnum) == -1)
		return -1;
	int res = data->varsetsnum;
	struct vardata_varset new = { strdup(name) };
	if (description)
		new.description = strdup(description);
	ADDARRAY(data->varsets, new);
	return res;
}